

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O3

double __thiscall
cuckoocache_tests::HitRateTest::test_cache<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (HitRateTest *this,size_t megabytes,double load)

{
  pointer puVar1;
  uchar *puVar2;
  uint256 *h_1;
  uint64_t uVar3;
  pointer puVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint256 *h;
  long lVar9;
  long in_FS_OFFSET;
  bool bVar10;
  bool bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  vector<uint256,_std::allocator<uint256>_> hashes;
  vector<uint256,_std::allocator<uint256>_> local_110;
  vector<uint256,_std::allocator<uint256>_> local_f8;
  cache<uint256,_SignatureCacheHasher> local_d8;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58 [4];
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_d8.size = 0;
  local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_d8.collection_flags.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
       )operator_new__(0);
  local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._8_8_ = 0;
  local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._8_8_ = 0;
  local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_d8.epoch_heuristic_counter = 0;
  local_d8.epoch_size = 0;
  local_d8.depth_limit = '\0';
  uVar8 = (megabytes & 0xfffffffffff) << 0xf;
  uVar5 = 0xffffffff;
  if (uVar8 < 0xffffffff) {
    uVar5 = uVar8;
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup(&local_d8,(uint32_t)uVar5);
  uVar5 = (long)((double)uVar8 * load) & 0xffffffff;
  std::vector<uint256,_std::allocator<uint256>_>::resize(&local_f8,uVar5);
  if (uVar5 != 0) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      puVar4 = local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        uVar3 = RandomMixin<FastRandomContext>::randbits<32>
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>);
        *(int *)((puVar4->super_base_blob<256U>).m_data._M_elems + lVar6 * 4 + lVar9) = (int)uVar3;
        lVar6 = lVar6 + 1;
      } while ((char)lVar6 != '\b');
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar8 != uVar5);
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector(&local_110,&local_f8);
  if (local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar4 = local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_78 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
      uStack_70 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
      local_68 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_60 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
                (&local_d8,
                 (base_blob<256U>)
                 *(base_blob<256U> *)(puVar4->super_base_blob<256U>).m_data._M_elems);
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start ==
      local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    dVar12 = 0.0;
  }
  else {
    uVar8 = (ulong)local_d8.size;
    uVar7 = 0;
    puVar4 = local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_58[0] = (uint)(*(uint *)(puVar4->super_base_blob<256U>).m_data._M_elems * uVar8 >> 0x20)
      ;
      local_58[1] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 4) * uVar8 >>
                         0x20);
      local_58[2] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8) * uVar8 >>
                         0x20);
      local_58[3] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0xc) * uVar8
                         >> 0x20);
      local_48 = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10) * uVar8 >>
                      0x20);
      local_44 = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x14) * uVar8 >>
                      0x20);
      local_40 = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18) * uVar8 >>
                      0x20);
      local_3c = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar8 >>
                      0x20);
      lVar9 = 0;
      do {
        puVar1 = local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start + *(uint *)((long)local_58 + lVar9);
        auVar13[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[0]);
        auVar13[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[1]);
        auVar13[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[2]);
        auVar13[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[3]);
        auVar13[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[4]);
        auVar13[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[5]);
        auVar13[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[6]);
        auVar13[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[7]);
        auVar13[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[8]);
        auVar13[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] ==
                      (puVar4->super_base_blob<256U>).m_data._M_elems[9]);
        auVar13[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] ==
                       (puVar4->super_base_blob<256U>).m_data._M_elems[10]);
        auVar13[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[0xb]);
        auVar13[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[0xc]);
        auVar13[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[0xd]);
        auVar13[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[0xe]);
        auVar13[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[0xf]);
        puVar2 = local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start[*(uint *)((long)local_58 + lVar9)].
                 super_base_blob<256U>.m_data._M_elems + 0x10;
        auVar14[0] = -(*puVar2 == (puVar4->super_base_blob<256U>).m_data._M_elems[0x10]);
        auVar14[1] = -(puVar2[1] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x11]);
        auVar14[2] = -(puVar2[2] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x12]);
        auVar14[3] = -(puVar2[3] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x13]);
        auVar14[4] = -(puVar2[4] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x14]);
        auVar14[5] = -(puVar2[5] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x15]);
        auVar14[6] = -(puVar2[6] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x16]);
        auVar14[7] = -(puVar2[7] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x17]);
        auVar14[8] = -(puVar2[8] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x18]);
        auVar14[9] = -(puVar2[9] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x19]);
        auVar14[10] = -(puVar2[10] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x1a]);
        auVar14[0xb] = -(puVar2[0xb] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x1b]);
        auVar14[0xc] = -(puVar2[0xc] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x1c]);
        auVar14[0xd] = -(puVar2[0xd] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x1d]);
        auVar14[0xe] = -(puVar2[0xe] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x1e]);
        auVar14[0xf] = -(puVar2[0xf] == (puVar4->super_base_blob<256U>).m_data._M_elems[0x1f]);
        auVar14 = auVar14 & auVar13;
        bVar10 = (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff;
        if (bVar10) break;
        bVar11 = lVar9 != 0x1c;
        lVar9 = lVar9 + 4;
      } while (bVar11);
      uVar7 = uVar7 + bVar10;
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    dVar12 = (double)uVar7;
  }
  if (local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._8_8_ =
         local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._8_8_ =
         local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_d8.collection_flags.mem._M_t.
      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
       )0x0) {
    operator_delete__((void *)local_d8.collection_flags.mem._M_t.
                              super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>.
                              _M_head_impl);
  }
  local_d8.collection_flags.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
       )(__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
         )0x0;
  if (local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return dVar12 / (double)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

double test_cache(size_t megabytes, double load)
{
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;
    /** Do the insert */
    for (const uint256& h : hashes_insert_copy)
        set.insert(h);
    /** Count the hits */
    uint32_t count = 0;
    for (const uint256& h : hashes)
        count += set.contains(h, false);
    double hit_rate = ((double)count) / ((double)n_insert);
    return hit_rate;
}